

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void nite::addProgram(uint T,GLuint ProgramId,Uniform *uniforms,string *name,Shader *ref)

{
  Uniform local_260;
  Program local_160;
  
  Uniform::Uniform(&local_260,uniforms);
  Program::Program(&local_160,ProgramId,&local_260,name,ref);
  std::vector<nite::Program,_std::allocator<nite::Program>_>::emplace_back<nite::Program>
            (&targets[T].programs,&local_160);
  Program::~Program(&local_160);
  Uniform::~Uniform(&local_260);
  return;
}

Assistant:

void addProgram(unsigned T, GLuint ProgramId, Uniform uniforms, const String &name, nite::Shader *ref){
        targets[T].programs.push_back(Program(ProgramId, uniforms, name, ref));
	}